

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

string * __thiscall
cmGlobalGenerator::NewDeferId_abi_cxx11_(string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char cVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string __str;
  long *local_70;
  uint local_68;
  long local_60 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  long *local_30;
  char **local_28;
  
  __val = this->NextDeferId;
  this->NextDeferId = __val + 1;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0023f2d2;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0023f2d2;
      }
      if (uVar3 < 10000) goto LAB_0023f2d2;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0023f2d2:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,__val);
  local_50.first._M_len = 2;
  local_50.first._M_str = "__";
  local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_30 = local_70;
  views._M_len = 2;
  views._M_array = &local_50;
  local_28 = (char **)&local_70;
  cmCatViews(__return_storage_ptr__,views);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::NewDeferId()
{
  return cmStrCat("__"_s, std::to_string(this->NextDeferId++));
}